

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_arithmetic.h
# Opt level: O0

double testinator::detail::Arbitrary_Arithmetic_Real<double>::generate
                 (size_t generation,unsigned_long randomSeed)

{
  TestRegistry *this;
  double __a;
  double __b;
  undefined1 local_38 [8];
  uniform_real_distribution<double> dis;
  mt19937 *gen;
  unsigned_long randomSeed_local;
  size_t generation_local;
  
  switch(generation) {
  case 0:
    generation_local = 0;
    break;
  case 1:
    generation_local = (size_t)::std::numeric_limits<double>::min();
    break;
  case 2:
    generation_local = (size_t)::std::numeric_limits<double>::max();
    break;
  case 3:
    generation_local = (size_t)::std::numeric_limits<double>::lowest();
    break;
  default:
    this = GetTestRegistry();
    dis._M_param._M_b = (double)TestRegistry::RNG(this);
    ::std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)dis._M_param._M_b,randomSeed);
    __a = ::std::numeric_limits<double>::min();
    __b = ::std::numeric_limits<double>::max();
    ::std::uniform_real_distribution<double>::uniform_real_distribution
              ((uniform_real_distribution<double> *)local_38,__a,__b);
    generation_local =
         (size_t)::std::uniform_real_distribution<double>::operator()
                           ((uniform_real_distribution<double> *)local_38,
                            (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)dis._M_param._M_b);
  }
  return (double)generation_local;
}

Assistant:

static T generate(std::size_t generation, unsigned long int randomSeed)
      {
        switch (generation)
        {
          case 0:
            return 0;
          case 1:
            return std::numeric_limits<T>::min();
          case 2:
            return std::numeric_limits<T>::max();
          case 3:
            return std::numeric_limits<T>::lowest();

          default:
          {
            std::mt19937& gen = testinator::GetTestRegistry().RNG();
            gen.seed(randomSeed);
            std::uniform_real_distribution<T> dis(
                std::numeric_limits<T>::min(), std::numeric_limits<T>::max());
            return dis(gen);
          }
        }
      }